

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O0

uint tcu::(anonymous_namespace)::convertSat<unsigned_int,unsigned_int>(uint src)

{
  uint uVar1;
  uint max;
  uint min;
  uint src_local;
  
  min = std::numeric_limits<unsigned_int>::min();
  uVar1 = std::numeric_limits<unsigned_int>::max();
  if ((min <= src) && (min = src, uVar1 < src)) {
    min = uVar1;
  }
  return min;
}

Assistant:

static inline T convertSat (S src)
{
	S min = (S)std::numeric_limits<T>::min();
	S max = (S)std::numeric_limits<T>::max();

	if (src < min)
		return (T)min;
	else if (src > max)
		return (T)max;
	else
		return (T)src;
}